

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

void __thiscall wasm::IRBuilder::push(IRBuilder *this,Expression *expr)

{
  pointer *pppEVar1;
  int iVar2;
  iterator __position;
  size_t sVar3;
  size_t sVar4;
  ScopeCtx *pSVar5;
  mapped_type *pmVar6;
  Expression *local_28;
  Expression *expr_local;
  
  local_28 = expr;
  pSVar5 = getScope(this);
  if ((expr->type).id == 1) {
    pSVar5->unreachable = true;
  }
  __position._M_current =
       (pSVar5->exprStack).
       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pSVar5->exprStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    _M_realloc_insert<wasm::Expression*const&>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pSVar5->exprStack,
               __position,&local_28);
    expr = local_28;
  }
  else {
    *__position._M_current = expr;
    pppEVar1 = &(pSVar5->exprStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  applyDebugLoc(this,expr);
  if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
    sVar3 = this->lastBinaryPos;
    sVar4 = *this->binaryPos;
    if (sVar3 != sVar4) {
      iVar2 = (int)this->codeSectionOffset;
      pmVar6 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->func->expressionLocations,&local_28);
      pmVar6->start = (int)sVar3 - iVar2;
      pmVar6->end = (int)sVar4 - iVar2;
      this->lastBinaryPos = *this->binaryPos;
    }
  }
  return;
}

Assistant:

void IRBuilder::push(Expression* expr) {
  auto& scope = getScope();
  if (expr->type == Type::unreachable) {
    scope.unreachable = true;
  }
  scope.exprStack.push_back(expr);

  applyDebugLoc(expr);
  if (binaryPos && func && lastBinaryPos != *binaryPos) {
    func->expressionLocations[expr] =
      BinaryLocations::Span{BinaryLocation(lastBinaryPos - codeSectionOffset),
                            BinaryLocation(*binaryPos - codeSectionOffset)};
    lastBinaryPos = *binaryPos;
  }

  DBG(std::cerr << "After pushing " << ShallowExpression{expr} << ":\n");
  DBG(dump());
}